

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

UBool __thiscall icu_63::RegexMatcher::isWordBoundary(RegexMatcher *this,int64_t pos)

{
  int iVar1;
  byte bVar2;
  UBool UVar3;
  int8_t iVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  UText *pUVar9;
  
  if (pos < this->fLookLimit) {
    pUVar9 = this->fInputText;
    uVar7 = pos - pUVar9->chunkNativeStart;
    if ((((long)uVar7 < 0) || ((long)pUVar9->nativeIndexingLimit <= (long)uVar7)) ||
       (0xdbff < (ushort)pUVar9->chunkContents[uVar7])) {
      utext_setNativeIndex_63(pUVar9,pos);
      pUVar9 = this->fInputText;
      uVar7 = (ulong)(uint)pUVar9->chunkOffset;
    }
    else {
      pUVar9->chunkOffset = (int32_t)uVar7;
    }
    if ((pUVar9->chunkLength <= (int)uVar7) ||
       (uVar6 = (uint)(ushort)pUVar9->chunkContents[(int)uVar7],
       0xd7ff < (ushort)pUVar9->chunkContents[(int)uVar7])) {
      uVar6 = utext_current32_63(pUVar9);
    }
    UVar3 = u_hasBinaryProperty_63(uVar6,UCHAR_GRAPHEME_EXTEND);
    if ((UVar3 != '\0') || (iVar4 = u_charType_63(uVar6), iVar4 == '\x10')) {
      return '\0';
    }
    bVar5 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar6);
  }
  else {
    this->fHitEnd = '\x01';
    bVar5 = 0;
  }
  do {
    pUVar9 = this->fInputText;
    if (pUVar9->nativeIndexingLimit < pUVar9->chunkOffset) {
      lVar8 = (*pUVar9->pFuncs->mapOffsetToNative)(pUVar9);
    }
    else {
      lVar8 = (long)pUVar9->chunkOffset + pUVar9->chunkNativeStart;
    }
    if (lVar8 <= this->fLookStart) {
      bVar2 = 0;
      goto LAB_00168493;
    }
    pUVar9 = this->fInputText;
    iVar1 = pUVar9->chunkOffset;
    if (((long)iVar1 < 1) || (0xd7ff < (ushort)pUVar9->chunkContents[(long)iVar1 + -1])) {
      uVar6 = utext_previous32_63(pUVar9);
    }
    else {
      pUVar9->chunkOffset = iVar1 - 1U;
      uVar6 = (uint)(ushort)pUVar9->chunkContents[iVar1 - 1U];
    }
    UVar3 = u_hasBinaryProperty_63(uVar6,UCHAR_GRAPHEME_EXTEND);
  } while ((UVar3 != '\0') || (iVar4 = u_charType_63(uVar6), iVar4 == '\x10'));
  bVar2 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar6);
LAB_00168493:
  return bVar2 ^ bVar5;
}

Assistant:

UBool RegexMatcher::isWordBoundary(int64_t pos) {
    UBool isBoundary = FALSE;
    UBool cIsWord    = FALSE;

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
    } else {
        // Determine whether char c at current position is a member of the word set of chars.
        // If we're off the end of the string, behave as though we're not at a word char.
        UTEXT_SETNATIVEINDEX(fInputText, pos);
        UChar32  c = UTEXT_CURRENT32(fInputText);
        if (u_hasBinaryProperty(c, UCHAR_GRAPHEME_EXTEND) || u_charType(c) == U_FORMAT_CHAR) {
            // Current char is a combining one.  Not a boundary.
            return FALSE;
        }
        cIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(c);
    }

    // Back up until we come to a non-combining char, determine whether
    //  that char is a word char.
    UBool prevCIsWord = FALSE;
    for (;;) {
        if (UTEXT_GETNATIVEINDEX(fInputText) <= fLookStart) {
            break;
        }
        UChar32 prevChar = UTEXT_PREVIOUS32(fInputText);
        if (!(u_hasBinaryProperty(prevChar, UCHAR_GRAPHEME_EXTEND)
              || u_charType(prevChar) == U_FORMAT_CHAR)) {
            prevCIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(prevChar);
            break;
        }
    }
    isBoundary = cIsWord ^ prevCIsWord;
    return isBoundary;
}